

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O1

status asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform
                 (reactor_op *base)

{
  bool bVar1;
  status sVar2;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> bufs;
  buf local_28;
  size_t local_18;
  
  local_28.iov_base = base[1].super_operation.func_;
  local_28.iov_len = *(size_t *)&base[1].super_operation.task_result_;
  local_18 = local_28.iov_len;
  bVar1 = socket_ops::non_blocking_recv
                    (*(socket_type *)&base[1].super_operation.next_,&local_28,1,base[1].ec_._M_value
                     ,(bool)((*(byte *)((long)&base[1].super_operation.next_ + 4) & 0x10) >> 4),
                     &base->ec_,&base->bytes_transferred_);
  sVar2 = (uint)bVar1;
  if (((bVar1) && (sVar2 = (uint)bVar1, ((ulong)base[1].super_operation.next_ & 0x1000000000) != 0))
     && (sVar2 = (status)bVar1, base->bytes_transferred_ == 0)) {
    sVar2 = done_and_exhausted;
  }
  return sVar2;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_recv(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        (o->state_ & socket_ops::stream_oriented) != 0,
        o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ == 0)
          result = done_and_exhausted;

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }